

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode add_next_timeout(curltime now,Curl_multi *multi,Curl_easy *d)

{
  time_node *ptVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  curltime *pcVar4;
  curl_llist *list_00;
  timediff_t tVar5;
  Curl_tree *pCVar6;
  curltime newer;
  curltime i;
  curltime older;
  timediff_t diff;
  curl_llist_element *n;
  time_node *node;
  curl_llist_element *e;
  curl_llist *list;
  curltime *tv;
  Curl_easy *d_local;
  Curl_multi *multi_local;
  curltime now_local;
  
  pcVar4 = &(d->state).expiretime;
  list_00 = &(d->state).timeoutlist;
  n = (curl_llist_element *)0x0;
  node = (time_node *)list_00->head;
  while (node != (time_node *)0x0) {
    ptVar1 = (time_node *)(node->list).next;
    n = (curl_llist_element *)(node->list).ptr;
    newer._12_4_ = 0;
    newer._0_12_ = *(undefined1 (*) [12])(n + 1);
    older._12_4_ = 0;
    older.tv_sec = SUB128(now._0_12_,0);
    older.tv_usec = SUB124(now._0_12_,8);
    tVar5 = Curl_timediff(newer,older);
    if (0 < tVar5) break;
    Curl_llist_remove(list_00,&node->list,(void *)0x0);
    node = ptVar1;
  }
  if (list_00->head == (curl_llist_element *)0x0) {
    pcVar4->tv_sec = 0;
    (d->state).expiretime.tv_usec = 0;
  }
  else {
    pcVar4->tv_sec = (time_t)n[1].ptr;
    *(curl_llist_element **)&(d->state).expiretime.tv_usec = n[1].prev;
    uVar2 = pcVar4->tv_sec;
    uVar3 = pcVar4->tv_usec;
    i.tv_usec = uVar3;
    i.tv_sec = uVar2;
    i._12_4_ = 0;
    pCVar6 = Curl_splayinsert(i,multi->timetree,&(d->state).timenode);
    multi->timetree = pCVar6;
  }
  return CURLM_OK;
}

Assistant:

static CURLMcode add_next_timeout(struct curltime now,
                                  struct Curl_multi *multi,
                                  struct Curl_easy *d)
{
  struct curltime *tv = &d->state.expiretime;
  struct curl_llist *list = &d->state.timeoutlist;
  struct curl_llist_element *e;
  struct time_node *node = NULL;

  /* move over the timeout list for this specific handle and remove all
     timeouts that are now passed tense and store the next pending
     timeout in *tv */
  for(e = list->head; e;) {
    struct curl_llist_element *n = e->next;
    timediff_t diff;
    node = (struct time_node *)e->ptr;
    diff = Curl_timediff(node->time, now);
    if(diff <= 0)
      /* remove outdated entry */
      Curl_llist_remove(list, e, NULL);
    else
      /* the list is sorted so get out on the first mismatch */
      break;
    e = n;
  }
  e = list->head;
  if(!e) {
    /* clear the expire times within the handles that we remove from the
       splay tree */
    tv->tv_sec = 0;
    tv->tv_usec = 0;
  }
  else {
    /* copy the first entry to 'tv' */
    memcpy(tv, &node->time, sizeof(*tv));

    /* Insert this node again into the splay.  Keep the timer in the list in
       case we need to recompute future timers. */
    multi->timetree = Curl_splayinsert(*tv, multi->timetree,
                                       &d->state.timenode);
  }
  return CURLM_OK;
}